

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingreply.h
# Opt level: O2

void __thiscall
QDBusPendingReply<QString,_QDBusObjectPath>::calculateMetaTypes
          (QDBusPendingReply<QString,_QDBusObjectPath> *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->super_QDBusPendingReplyBase != (QDBusPendingReplyBase)0x0) {
    QDBusPendingReplyBase::setMetaTypes((int)this,(QMetaType *)0x2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void calculateMetaTypes()
    {
        if (!d) return;
        if constexpr (Count == 0) {
                setMetaTypes(0, nullptr);
        } else {
            std::array<QMetaType, Count> typeIds = { QDBusPendingReplyTypes::metaTypeFor<Types>()... };
            setMetaTypes(Count, typeIds.data());
        }
    }